

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Statistics *
embree::SceneGraph::calculateStatistics
          (Statistics *__return_storage_ptr__,Ref<embree::SceneGraph::Node> *node)

{
  memset(__return_storage_ptr__,0,0xb8);
  (*(node->ptr->super_RefCount)._vptr_RefCount[9])(node->ptr,__return_storage_ptr__);
  (*(node->ptr->super_RefCount)._vptr_RefCount[8])();
  return __return_storage_ptr__;
}

Assistant:

SceneGraph::Statistics SceneGraph::calculateStatistics(Ref<Node> node)
  {
    SceneGraph::Statistics stat;
    node->calculateStatistics(stat);
    node->resetInDegree();
    return stat;
  }